

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_id(bcf_hdr_t *hdr,bcf1_t *line,char *id)

{
  int *piVar1;
  char *p;
  kstring_t tmp;
  kstring_t local_28;
  
  local_28.l = 0;
  local_28.s = (line->d).id;
  local_28.m = (size_t)(line->d).m_id;
  p = ".";
  if (id != (char *)0x0) {
    p = id;
  }
  kputs(p,&local_28);
  (line->d).id = local_28.s;
  (line->d).m_id = (int)local_28.m;
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 1;
  return 0;
}

Assistant:

int bcf_update_id(const bcf_hdr_t *hdr, bcf1_t *line, const char *id)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.id; tmp.m = line->d.m_id;
    if ( id )
        kputs(id, &tmp);
    else
        kputs(".", &tmp);
    line->d.id = tmp.s; line->d.m_id = tmp.m;
    line->d.shared_dirty |= BCF1_DIRTY_ID;
    return 0;
}